

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O3

int matchcharclass(char c,char *str)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = 0x19 < (byte)((c & 0xdfU) + 0xbf);
  bVar5 = (byte)(c - 0x30U) < 10;
  uVar2 = (uint)c;
  do {
    bVar3 = *str;
    if (c == '-') {
LAB_00114c3f:
      if (bVar3 == 0x5c) {
        bVar3 = ((byte *)str)[1];
        if (bVar3 < 100) {
          if (bVar3 == 0x44) {
            if ((byte)(c - 0x3aU) < 0xf6) {
              return 1;
            }
          }
          else if (bVar3 == 0x53) {
            if ((4 < uVar2 - 9) && (uVar2 != 0x20)) {
              return 1;
            }
          }
          else if (bVar3 == 0x57) {
            bVar1 = (byte)(c - 0x3aU) < 0xf6;
            if (bVar4 && c != '_') goto LAB_00114cc4;
          }
          else {
LAB_00114cd2:
            if (bVar3 == c) {
              return 1;
            }
          }
        }
        else {
          bVar1 = bVar5;
          if (bVar3 != 100) {
            if (bVar3 == 0x73) {
              if ((uVar2 < 0x21) && ((0x100003e00U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
                return 1;
              }
              goto LAB_00114cf3;
            }
            if (bVar3 != 0x77) goto LAB_00114cd2;
            if (!bVar4 || c == '_') {
              return 1;
            }
          }
LAB_00114cc4:
          if (bVar1) {
            return 1;
          }
        }
LAB_00114cf3:
        str = (char *)((byte *)str + 1);
        if (bVar3 == c) {
          if (0x33 < uVar2 - 0x44) {
            return 1;
          }
          if ((0x8800100088001U >> ((ulong)(uVar2 - 0x44) & 0x3f) & 1) == 0) {
            return 1;
          }
        }
      }
      else if (bVar3 == c) {
        if (c != '-') {
          return 1;
        }
        if (((byte *)str)[-1] != 0) {
          return (uint)(((byte *)str)[1] == 0);
        }
        return 1;
      }
    }
    else {
      if ((bVar3 != 0) && (bVar3 != 0x2d)) {
        if ((((byte *)str)[1] == 0x2d) &&
           (((c <= (char)((byte *)str)[2] && ((char)bVar3 <= c)) && (((byte *)str)[2] != 0)))) {
          return 1;
        }
        goto LAB_00114c3f;
      }
      if (bVar3 == c) {
        return 1;
      }
    }
    str = (char *)((byte *)str + 1);
    if (bVar3 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int matchcharclass(char c, const char* str)
{
  do
  {
    if (matchrange(c, str))
    {
      return 1;
    }
    else if (str[0] == '\\')
    {
      /* Escape-char: increment str-ptr and match on next char */
      str += 1;
      if (matchmetachar(c, str))
      {
        return 1;
      } 
      else if ((c == str[0]) && !ismetachar(c))
      {
        return 1;
      }
    }
    else if (c == str[0])
    {
      if (c == '-')
      {
        return ((str[-1] == '\0') || (str[1] == '\0'));
      }
      else
      {
        return 1;
      }
    }
  }
  while (*str++ != '\0');

  return 0;
}